

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_m2vd_vdpu2.c
# Opt level: O3

MPP_RET hal_m2vd_vdpu2_gen_regs(void *hal,HalTaskInfo *task)

{
  uint *puVar1;
  long lVar2;
  undefined4 *puVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  void *__dest;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  RK_U32 *p_reg;
  uint uVar11;
  uint uVar12;
  M2vdVdpu2Reg *p_regs;
  ulong uVar13;
  MppBuffer framebuf;
  MppBuffer streambuf;
  MppBuffer local_40;
  MppBuffer local_38;
  
  if ((task->dec).valid == 0) {
    return MPP_OK;
  }
  local_38 = (MppBuffer)0x0;
  local_40 = (MppBuffer)0x0;
  puVar1 = (uint *)(task->dec).syntax.data;
  lVar2 = *(long *)((long)hal + 0x68);
  (task->dec).valid = 0;
  __dest = mpp_buffer_get_ptr_with_caller
                     (*(MppBuffer *)((long)hal + 0x78),"hal_m2vd_vdpu2_gen_regs");
  memcpy(__dest,*(void **)(puVar1 + 4),0x100);
  mpp_buffer_sync_end_f(*(MppBuffer *)((long)hal + 0x78),0,"hal_m2vd_vdpu2_gen_regs");
  puVar3 = *(undefined4 **)((long)hal + 0x68);
  memset(puVar3 + 1,0,0x278);
  *(undefined8 *)(puVar3 + 0x38) = 0x3000100000;
  *(undefined8 *)(puVar3 + 0x34) = 0x800100000;
  *(undefined8 *)(puVar3 + 0x36) = 0x3f;
  *puVar3 = 0;
  puVar3[0x88] = 6;
  uVar6 = *(uint *)(lVar2 + 0x220);
  *(uint *)(lVar2 + 0x220) = uVar6 | 6;
  uVar7 = uVar6 & 0xfff87fff | 6;
  if (puVar1[8] == 0) {
    *(undefined4 *)(lVar2 + 0xd4) = 6;
    uVar4 = (puVar1[0x24] & 0xf) << 0xf;
    *(uint *)(lVar2 + 0x220) = uVar4 | uVar7;
    uVar7 = (puVar1[0x24] & 0xf) << 0xb;
    *(uint *)(lVar2 + 0x220) = uVar4 | uVar6 & 0xfff807ff | 6 | uVar7;
    uVar8 = (puVar1[0x26] & 0xf) << 7;
    *(uint *)(lVar2 + 0x220) = uVar4 | uVar6 & 0xfff8007f | 6 | uVar7 | uVar8;
    uVar6 = (uVar4 | uVar6 & 0xfff80007 | 6 | uVar7 | uVar8) + (puVar1[0x26] & 0xf) * 8;
    *(uint *)(lVar2 + 0x220) = uVar6;
    if (puVar1[0x23] != 0) {
      uVar6 = uVar6 & 0xfffffffb;
      *(uint *)(lVar2 + 0x220) = uVar6;
    }
    if (puVar1[0x25] == 0) goto LAB_001fbd7d;
    uVar6 = uVar6 & 0xfffffffd;
  }
  else {
    *(undefined4 *)(lVar2 + 0xd4) = 5;
    uVar4 = (puVar1[0x23] & 0xf) << 0xf;
    *(uint *)(lVar2 + 0x220) = uVar4 | uVar7;
    uVar7 = (puVar1[0x24] & 0xf) << 0xb;
    *(uint *)(lVar2 + 0x220) = uVar4 | uVar6 & 0xfff807ff | 6 | uVar7;
    uVar8 = (puVar1[0x25] & 0xf) << 7;
    *(uint *)(lVar2 + 0x220) = uVar4 | uVar6 & 0xfff8007f | 6 | uVar7 | uVar8;
    uVar6 = (uVar4 | uVar6 & 0xfff80007 | 6 | uVar7 | uVar8) + (puVar1[0x26] & 0xf) * 8;
  }
  *(uint *)(lVar2 + 0x220) = uVar6;
LAB_001fbd7d:
  uVar8 = puVar1[9] * 0x80000 + 0x780000 & 0xff800000;
  uVar7 = *(uint *)(lVar2 + 0x1e0);
  *(uint *)(lVar2 + 0x1e0) = uVar7 & 0x7fffff | uVar8;
  uVar9 = puVar1[10] * 0x80 + 0x780 & 0x7f800;
  *(uint *)(lVar2 + 0x1e0) = uVar7 & 0x7807ff | uVar8 | uVar9;
  uVar12 = puVar1[0x13] * -0x20000 + 0x20000 & 0x20000;
  uVar4 = *(uint *)(lVar2 + 0xe4);
  uVar10 = uVar4 & 0xfffdffff | uVar12;
  *(uint *)(lVar2 + 0xe4) = uVar10;
  if (puVar1[0x32] == 3) {
    uVar12 = uVar4 & 0xfffcffff | uVar12;
  }
  else {
    *(uint *)(lVar2 + 0xe4) = uVar10 | 0x10000;
    uVar12 = uVar4 & 0xfffddfff | uVar12 | 0x10000 | (uint)(puVar1[0x32] == 1) << 0xd;
  }
  *(uint *)(lVar2 + 0xe4) = uVar12;
  uVar10 = (uint)(puVar1[0x20] == 3) << 0xf;
  *(uint *)(lVar2 + 0xe4) = uVar10 | uVar12 & 0xffff7fff;
  uVar4 = (uint)(puVar1[0x20] != 1) << 0xe;
  *(uint *)(lVar2 + 0xe4) = uVar4 | uVar10 | uVar12 & 0xffff3fff;
  uVar11 = (puVar1[0x33] & 1) << 5;
  *(uint *)(lVar2 + 0x1e0) = uVar7 & 0x7807df | uVar8 | uVar9 | uVar11;
  *(uint *)(lVar2 + 0xe4) = uVar4 | uVar10 | uVar12 & 0xffff2bff;
  *(uint *)(lVar2 + 0x1e0) = uVar7 & 0x78079f | uVar8 | uVar9 | uVar11 | (puVar1[0x38] & 1) << 6;
  *(uint *)(lVar2 + 0x220) = uVar6 & 0xfff7ffff | (puVar1[0x38] & 1) << 0x13;
  uVar7 = (puVar1[0x36] & 1) << 0x18;
  uVar6 = *(uint *)(lVar2 + 0x1e8);
  *(uint *)(lVar2 + 0x1e8) = uVar6 & 0xfeffffff | uVar7;
  uVar6 = (uVar6 & 0xfefffff3 | uVar7) + (puVar1[0x31] & 3) * 4;
  *(uint *)(lVar2 + 0x1e8) = uVar6;
  uVar7 = (puVar1[0x35] & 1) << 4;
  *(uint *)(lVar2 + 0x1e8) = uVar6 & 0xffffffef | uVar7;
  uVar6 = (uVar6 & 0xffffffed | uVar7) + (puVar1[0x37] & 1) * 2;
  *(uint *)(lVar2 + 0x1e8) = uVar6;
  *(uint *)(lVar2 + 0x1e8) = uVar6 & 0xfffffffe | puVar1[0x34] & 1;
  *(uint *)(lVar2 + 0xcc) = *(uint *)(lVar2 + 0xcc) & 0x81ffffff | 0x2000000;
  mpp_buf_slot_get_prop(*(MppBufSlots *)((long)hal + 0x58),(task->dec).input,SLOT_BUFFER,&local_38);
  iVar5 = mpp_buffer_get_fd_with_caller(local_38,"hal_m2vd_vdpu2_gen_regs");
  *(int *)(lVar2 + 0x100) = iVar5;
  if (puVar1[2] != 0) {
    mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 0x90),0x40,puVar1[2]);
  }
  mpp_buf_slot_get_prop
            (*(MppBufSlots *)((long)hal + 0x60),(byte)puVar1[6] & 0x7f,SLOT_BUFFER,&local_40);
  if ((puVar1[0x32] | 2) == 3) {
    iVar5 = mpp_buffer_get_fd_with_caller(local_40,"hal_m2vd_vdpu2_gen_regs");
    *(int *)(lVar2 + 0xfc) = iVar5;
  }
  else {
    iVar5 = mpp_buffer_get_fd_with_caller(local_40,"hal_m2vd_vdpu2_gen_regs");
    *(int *)(lVar2 + 0xfc) = iVar5;
    mpp_dev_set_reg_offset(*(MppDev *)((long)hal + 0x90),0x3f,puVar1[9] + 0xf & 0xfffffff0);
  }
  mpp_buf_slot_get_prop
            (*(MppBufSlots *)((long)hal + 0x60),*(byte *)((long)puVar1 + 0x19) & 0x7f,SLOT_BUFFER,
             &local_40);
  iVar5 = mpp_buffer_get_fd_with_caller(local_40,"hal_m2vd_vdpu2_gen_regs");
  *(int *)(lVar2 + 0x20c) = iVar5;
  mpp_buf_slot_get_prop
            (*(MppBufSlots *)((long)hal + 0x60),*(byte *)((long)puVar1 + 0x1a) & 0x7f,SLOT_BUFFER,
             &local_40);
  iVar5 = mpp_buffer_get_fd_with_caller(local_40,"hal_m2vd_vdpu2_gen_regs");
  *(int *)(lVar2 + 0x250) = iVar5;
  mpp_buf_slot_get_prop
            (*(MppBufSlots *)((long)hal + 0x60),*(byte *)((long)puVar1 + 0x1b) & 0x7f,SLOT_BUFFER,
             &local_40);
  iVar5 = mpp_buffer_get_fd_with_caller(local_40,"hal_m2vd_vdpu2_gen_regs");
  *(int *)(lVar2 + 0x218) = iVar5;
  mpp_buf_slot_get_prop
            (*(MppBufSlots *)((long)hal + 0x60),(byte)puVar1[7] & 0x7f,SLOT_BUFFER,&local_40);
  iVar5 = mpp_buffer_get_fd_with_caller(local_40,"hal_m2vd_vdpu2_gen_regs");
  *(int *)(lVar2 + 0x21c) = iVar5;
  iVar5 = mpp_buffer_get_fd_with_caller(*(MppBuffer *)((long)hal + 0x78),"hal_m2vd_vdpu2_gen_regs");
  *(int *)(lVar2 + 0xf4) = iVar5;
  *(uint *)(lVar2 + 0xd0) = *(uint *)(lVar2 + 0xd0) & 0xfffe0000;
  uVar6 = *(uint *)(lVar2 + 0xe4) & 0xfffffffb;
  *(uint *)(lVar2 + 0xe4) = uVar6;
  *(byte *)(lVar2 + 0xc9) = *(byte *)(lVar2 + 0xc9) | 1;
  *(uint *)(lVar2 + 0xcc) = *puVar1 & 0xffffff | (uint)*(byte *)(lVar2 + 0xcf) << 0x18;
  *(uint *)(lVar2 + 0x1e8) = *(uint *)(lVar2 + 0x1e8) & 0x3ffffff | puVar1[1] << 0x1a;
  *(uint *)(lVar2 + 0xe4) = uVar6 | 1;
  if (((byte)m2vh_debug & 2) != 0) {
    uVar13 = 0x32;
    do {
      _mpp_log_l(4,"hal_m2vd_vdpu2","reg[%d] = 0x%08x",(char *)0x0,uVar13 & 0xffffffff,
                 (ulong)*(uint *)(lVar2 + uVar13 * 4));
      uVar13 = uVar13 + 1;
    } while (uVar13 != 0x9f);
  }
  if (*(long *)((long)hal + 0x98) != 0) {
    _mpp_log_l(4,"hal_m2vd_vdpu2","fwrite regs start",(char *)0x0);
    fprintf(*(FILE **)((long)hal + 0x98),"Frame #%d\n",(ulong)*(uint *)((long)hal + 0x80));
    uVar13 = 0;
    do {
      fprintf(*(FILE **)((long)hal + 0x98),"[(D)%03d, (X)%03x]  %08x\n",uVar13 & 0xffffffff,
              uVar13 & 0xffffffff,(ulong)*(uint *)(lVar2 + uVar13 * 4));
      uVar13 = uVar13 + 1;
    } while (uVar13 != 0x9f);
    fflush(*(FILE **)((long)hal + 0x98));
  }
  (task->dec).valid = 1;
  *(int *)((long)hal + 0x80) = *(int *)((long)hal + 0x80) + 1;
  return MPP_OK;
}

Assistant:

MPP_RET hal_m2vd_vdpu2_gen_regs(void *hal, HalTaskInfo *task)
{
    MPP_RET ret = MPP_OK;

    if (task->dec.valid) {
        void *q_table = NULL;
        MppBuffer streambuf = NULL;
        MppBuffer framebuf = NULL;
        M2vdHalCtx *ctx = (M2vdHalCtx *)hal;
        M2VDDxvaParam *dx = (M2VDDxvaParam *)task->dec.syntax.data;
        M2vdVdpu2Reg *p_regs = ctx->regs;

        task->dec.valid = 0;
        q_table = mpp_buffer_get_ptr(ctx->qp_table);
        memcpy(q_table, dx->qp_tab, M2VD_BUF_SIZE_QPTAB);
        mpp_buffer_sync_end(ctx->qp_table);

        hal_m2vd_vdpu2_init_hwcfg(ctx);

        p_regs->sw136.mv_accuracy_fwd = 1;
        p_regs->sw136.mv_accuracy_bwd = 1;
        if (dx->seq_ext_head_dec_flag) {
            p_regs->sw53.sw_dec_mode = 5;
            p_regs->sw136.fcode_fwd_hor = dx->pic.full_pel_forward_vector;
            p_regs->sw136.fcode_fwd_ver = dx->pic.forward_f_code;
            p_regs->sw136.fcode_bwd_hor = dx->pic.full_pel_backward_vector;
            p_regs->sw136.fcode_bwd_ver = dx->pic.backward_f_code;

        } else {
            p_regs->sw53.sw_dec_mode = 6;
            p_regs->sw136.fcode_fwd_hor = dx->pic.forward_f_code;
            p_regs->sw136.fcode_fwd_ver = dx->pic.forward_f_code;
            p_regs->sw136.fcode_bwd_hor = dx->pic.backward_f_code;
            p_regs->sw136.fcode_bwd_ver = dx->pic.backward_f_code;
            if (dx->pic.full_pel_forward_vector)
                p_regs->sw136.mv_accuracy_fwd = 0;
            if (dx->pic.full_pel_backward_vector)
                p_regs->sw136.mv_accuracy_bwd = 0;
        }

        p_regs->sw120.pic_mb_width = (dx->seq.decode_width + 15) >> 4;
        p_regs->sw120.pic_mb_height_p = (dx->seq.decode_height + 15) >> 4;
        p_regs->sw57.pic_interlace_e = 1 - dx->seq_ext.progressive_sequence;
        if (dx->pic_code_ext.picture_structure == M2VD_PIC_STRUCT_FRAME)
            p_regs->sw57.pic_fieldmode_e = 0;
        else {
            p_regs->sw57.pic_fieldmode_e = 1;
            p_regs->sw57.pic_topfield_e = dx->pic_code_ext.picture_structure == 1;
        }
        if (dx->pic.picture_coding_type == M2VD_CODING_TYPE_B)
            p_regs->sw57.pic_b_e = 1;
        else
            p_regs->sw57.pic_b_e = 0;
        if (dx->pic.picture_coding_type == M2VD_CODING_TYPE_I)
            p_regs->sw57.pic_inter_e = 0;
        else
            p_regs->sw57.pic_inter_e = 1;

        p_regs->sw120.topfieldfirst_e = dx->pic_code_ext.top_field_first;
        p_regs->sw57.fwd_interlace_e = 0;
        p_regs->sw57.write_mvs_e = 0;//concealment_motion_vectors;
        p_regs->sw120.alt_scan_e = dx->pic_code_ext.alternate_scan;
        p_regs->sw136.alt_scan_flag_e = dx->pic_code_ext.alternate_scan;

        p_regs->sw122.qscale_type = dx->pic_code_ext.q_scale_type;
        p_regs->sw122.intra_dc_prec = dx->pic_code_ext.intra_dc_precision;
        p_regs->sw122.con_mv_e = dx->pic_code_ext.concealment_motion_vectors;
        p_regs->sw122.intra_vlc_tab = dx->pic_code_ext.intra_vlc_format;
        p_regs->sw122.frame_pred_dct = dx->pic_code_ext.frame_pred_frame_dct;
        p_regs->sw51.init_qp = 1;

        mpp_buf_slot_get_prop(ctx->packet_slots, task->dec.input, SLOT_BUFFER, &streambuf);
        p_regs->sw64.VLC_base = mpp_buffer_get_fd(streambuf);
        if (dx->bitstream_offset) {
            mpp_dev_set_reg_offset(ctx->dev, 64, dx->bitstream_offset);
        }

        mpp_buf_slot_get_prop(ctx->frame_slots, dx->CurrPic.Index7Bits, SLOT_BUFFER, &framebuf);


        if ((dx->pic_code_ext.picture_structure == M2VD_PIC_STRUCT_TOP_FIELD) ||
            (dx->pic_code_ext.picture_structure == M2VD_PIC_STRUCT_FRAME)) {
            p_regs->sw63.cur_pic_base = mpp_buffer_get_fd(framebuf); //just index need map
        } else {
            p_regs->sw63.cur_pic_base = mpp_buffer_get_fd(framebuf);
            mpp_dev_set_reg_offset(ctx->dev, 63, MPP_ALIGN(dx->seq.decode_width, 16));
        }

        //ref & qtable config
        mpp_buf_slot_get_prop(ctx->frame_slots, dx->frame_refs[0].Index7Bits, SLOT_BUFFER, &framebuf);
        p_regs->sw131.ref0  = mpp_buffer_get_fd(framebuf); //just index need map

        mpp_buf_slot_get_prop(ctx->frame_slots, dx->frame_refs[1].Index7Bits, SLOT_BUFFER, &framebuf);
        p_regs->sw148.ref1  = mpp_buffer_get_fd(framebuf); //just index need map

        mpp_buf_slot_get_prop(ctx->frame_slots, dx->frame_refs[2].Index7Bits, SLOT_BUFFER, &framebuf);
        p_regs->sw134.ref2  = mpp_buffer_get_fd(framebuf); //just index need map

        mpp_buf_slot_get_prop(ctx->frame_slots, dx->frame_refs[3].Index7Bits, SLOT_BUFFER, &framebuf);
        p_regs->sw135.ref3  = mpp_buffer_get_fd(framebuf); //just index need map

        p_regs->sw61.slice_table = mpp_buffer_get_fd(ctx->qp_table);

        p_regs->sw52.startmb_x = 0;
        p_regs->sw52.startmb_y = 0;
        p_regs->sw57.dec_out_dis = 0;
        p_regs->sw50.filtering_dis = 1;

        p_regs->sw51.stream_len = dx->bitstream_length;
        p_regs->sw122.stream_start_bit = dx->bitstream_start_bit;
        p_regs->sw57.dec_e = 1;

        if (M2VH_DBG_REG & m2vh_debug) {
            RK_U32 j = 0;
            RK_U32 *p_reg = (RK_U32 *)p_regs;
            for (j = 50; j < 159; j++) {
                mpp_log("reg[%d] = 0x%08x", j, p_reg[j]);
            }
        }
        if (ctx->fp_reg_in) {
            int k = 0;
            RK_U32 *p_reg = (RK_U32*)p_regs;
            mpp_log("fwrite regs start");
            fprintf(ctx->fp_reg_in, "Frame #%d\n", ctx->dec_frame_cnt);
            for (k = 0; k < M2VD_VDPU2_REG_NUM; k++)
                fprintf(ctx->fp_reg_in, "[(D)%03d, (X)%03x]  %08x\n", k, k, p_reg[k]);
            fflush(ctx->fp_reg_in);
        }

        task->dec.valid = 1;
        ctx->dec_frame_cnt++;
    }
    return ret;

}